

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort.cpp
# Opt level: O2

void merge_4way(uchar **from0,size_t n0,uchar **from1,size_t n1,uchar **from2,size_t n2,
               uchar **from3,size_t n3,uchar **result)

{
  undefined8 *puVar1;
  uchar *puVar2;
  uchar *puVar3;
  uchar *puVar4;
  uchar *puVar5;
  uchar **ppuVar6;
  int iVar7;
  int iVar8;
  size_t n1_00;
  uchar **ppuVar9;
  long lVar10;
  char *pcVar11;
  uchar **local_68;
  uchar **local_60;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  
  local_60 = result;
  puVar2 = *from0;
  puVar3 = *from1;
  iVar7 = cmp(puVar2,puVar3);
  puVar4 = *from2;
  iVar8 = cmp(puVar3,puVar4);
  local_40 = n2;
  local_50 = n0;
  local_68 = from1;
  local_48 = n1;
  if (iVar7 < 1) {
    if (iVar8 < 1) {
      puVar5 = *from3;
      iVar7 = cmp(puVar5,puVar2);
      if (iVar7 < 0) goto LAB_001b9bd8;
      iVar7 = cmp(puVar5,puVar3);
      if (iVar7 < 0) goto LAB_001b9dae;
      iVar7 = cmp(puVar5,puVar4);
      if (-1 < iVar7) goto LAB_001b9c83;
      goto LAB_001b9ac4;
    }
    iVar7 = cmp(puVar4,puVar2);
    puVar5 = *from3;
    if (-1 < iVar7) {
      iVar7 = cmp(puVar5,puVar2);
      if (iVar7 < 0) goto LAB_001b9825;
      iVar7 = cmp(puVar5,puVar4);
      if (iVar7 < 0) goto LAB_001b99bf;
      iVar7 = cmp(puVar5,puVar3);
      goto joined_r0x001b8679;
    }
    iVar7 = cmp(puVar5,puVar4);
    if (iVar7 < 0) goto LAB_001b9cb9;
    iVar7 = cmp(puVar5,puVar2);
    if (iVar7 < 0) goto LAB_001b9da2;
    iVar7 = cmp(puVar5,puVar3);
    goto joined_r0x001b9d52;
  }
  if (iVar8 < 1) {
    iVar7 = cmp(puVar2,puVar4);
    puVar5 = *from3;
    iVar8 = cmp(puVar5,puVar3);
    if (iVar7 < 1) {
      if (iVar8 < 0) goto LAB_001b98f8;
      iVar7 = cmp(puVar5,puVar2);
      if (iVar7 < 0) goto LAB_001b99b3;
      iVar7 = cmp(puVar5,puVar4);
      goto joined_r0x001b898c;
    }
    if (iVar8 < 0) goto LAB_001b8ede;
    iVar7 = cmp(puVar5,puVar4);
    if (iVar7 < 0) goto LAB_001b960d;
    iVar7 = cmp(puVar5,puVar2);
    local_58 = n3;
    if (-1 < iVar7) goto LAB_001b8f8a;
    goto LAB_001b96ee;
  }
  puVar5 = *from3;
  iVar7 = cmp(puVar5,puVar4);
  if (iVar7 < 0) goto LAB_001b870e;
  iVar7 = cmp(puVar5,puVar3);
  local_58 = n3;
  if (iVar7 < 0) goto LAB_001b8837;
  iVar7 = cmp(puVar5,puVar2);
  if (iVar7 < 0) goto LAB_001b954a;
LAB_001b8543:
  do {
    lVar10 = 0;
    do {
      iVar7 = cmp(*(void **)((long)from2 + lVar10),*local_68);
      if (0 < iVar7) {
        pcVar11 = "cmp(*from2, *from1) <= 0";
        goto LAB_001b9aeb;
      }
      iVar7 = cmp(*local_68,*from0);
      if (0 < iVar7) {
        pcVar11 = "cmp(*from1, *from0) <= 0";
        goto LAB_001b9aeb;
      }
      iVar7 = cmp(*from0,*from3);
      if (0 < iVar7) goto LAB_001b912a;
      *(undefined8 *)((long)local_60 + lVar10) = *(undefined8 *)((long)from2 + lVar10);
      ppuVar9 = from3;
      if (local_40 == 1) goto LAB_001b9c8a;
      iVar7 = cmp(*(void **)((long)from2 + lVar10 + 8),*local_68);
      lVar10 = lVar10 + 8;
      local_40 = local_40 - 1;
    } while (iVar7 < 0);
    puVar1 = (undefined8 *)((long)from2 + lVar10);
    from2 = (uchar **)((long)from2 + lVar10);
    iVar7 = cmp((void *)*puVar1,*from0);
    local_60 = (uchar **)((long)local_60 + lVar10);
    if (iVar7 < 0) goto LAB_001b8f8a;
    iVar7 = cmp(*from2,*from3);
    n3 = local_58;
    if (0 < iVar7) goto LAB_001b99a7;
LAB_001b999b:
    lVar10 = 0;
    do {
      iVar7 = cmp(*(void **)((long)local_68 + lVar10),*from0);
      if (0 < iVar7) goto LAB_001b9368;
      iVar7 = cmp(*from0,*from2);
      if (0 < iVar7) {
        pcVar11 = "cmp(*from0, *from2) <= 0";
        goto LAB_001b936f;
      }
      iVar7 = cmp(*from2,*from3);
      if (0 < iVar7) {
        pcVar11 = "cmp(*from2, *from3) <= 0";
        goto LAB_001b936f;
      }
      *(undefined8 *)((long)local_60 + lVar10) = *(undefined8 *)((long)local_68 + lVar10);
      ppuVar9 = from2;
      local_58 = n3;
      if (local_48 == 1) goto LAB_001b98d3;
      iVar7 = cmp(*(void **)((long)local_68 + lVar10 + 8),*from0);
      lVar10 = lVar10 + 8;
      local_48 = local_48 - 1;
    } while (iVar7 < 0);
    puVar1 = (undefined8 *)((long)local_68 + lVar10);
    local_68 = (uchar **)((long)local_68 + lVar10);
    iVar7 = cmp((void *)*puVar1,*from2);
    local_60 = (uchar **)((long)local_60 + lVar10);
    if (iVar7 < 1) goto LAB_001b9c83;
    iVar7 = cmp(*local_68,*from3);
    if (0 < iVar7) goto LAB_001b98cc;
LAB_001b9acb:
    lVar10 = 0;
    do {
      iVar7 = cmp(*(void **)((long)from0 + lVar10),*from2);
      if (0 < iVar7) {
        pcVar11 = "cmp(*from0, *from2) <= 0";
        goto LAB_001b8b77;
      }
      iVar7 = cmp(*from2,*local_68);
      if (0 < iVar7) {
        pcVar11 = "cmp(*from2, *from1) <= 0";
        goto LAB_001b8b77;
      }
      iVar7 = cmp(*local_68,*from3);
      if (0 < iVar7) goto LAB_001b8c4e;
      *(undefined8 *)((long)local_60 + lVar10) = *(undefined8 *)((long)from0 + lVar10);
      local_58 = n3;
      ppuVar9 = from2;
      ppuVar6 = from3;
      if (local_50 == 1) goto LAB_001b9237;
      iVar7 = cmp(*(void **)((long)from0 + lVar10 + 8),*from2);
      lVar10 = lVar10 + 8;
      local_50 = local_50 - 1;
    } while (iVar7 < 1);
    puVar1 = (undefined8 *)((long)from0 + lVar10);
    from0 = (uchar **)((long)from0 + lVar10);
    iVar7 = cmp((void *)*puVar1,*local_68);
    local_60 = (uchar **)((long)local_60 + lVar10);
    if (iVar7 < 1) goto LAB_001b9d58;
    iVar7 = cmp(*from0,*from3);
    if (0 < iVar7) {
LAB_001b954a:
      lVar10 = 0;
      while( true ) {
        iVar7 = cmp(*(void **)((long)from2 + lVar10),*local_68);
        if (0 < iVar7) {
          pcVar11 = "cmp(*from2, *from1) <= 0";
          goto LAB_001b9b03;
        }
        iVar7 = cmp(*local_68,*from3);
        if (0 < iVar7) break;
        iVar7 = cmp(*from3,*from0);
        if (0 < iVar7) goto LAB_001b9b1b;
        *(undefined8 *)((long)local_60 + lVar10) = *(undefined8 *)((long)from2 + lVar10);
        ppuVar9 = from3;
        if (local_40 == 1) goto LAB_001b9c8a;
        iVar7 = cmp(*(void **)((long)from2 + lVar10 + 8),*local_68);
        lVar10 = lVar10 + 8;
        local_40 = local_40 - 1;
        if (-1 < iVar7) {
          puVar1 = (undefined8 *)((long)from2 + lVar10);
          from2 = (uchar **)((long)from2 + lVar10);
          iVar7 = cmp((void *)*puVar1,*from3);
          local_60 = (uchar **)((long)local_60 + lVar10);
          if (iVar7 < 1) goto LAB_001b96ee;
          iVar7 = cmp(*from2,*from0);
          n3 = local_58;
          if (-1 < iVar7) goto LAB_001b99b3;
LAB_001b960d:
          lVar10 = 0;
          do {
            iVar7 = cmp(*(void **)((long)local_68 + lVar10),*from3);
            if (0 < iVar7) goto LAB_001b99d2;
            iVar7 = cmp(*from3,*from2);
            if (0 < iVar7) {
              pcVar11 = "cmp(*from3, *from2) <= 0";
              goto LAB_001b9734;
            }
            iVar7 = cmp(*from2,*from0);
            if (0 < iVar7) {
              pcVar11 = "cmp(*from2, *from0) <= 0";
              goto LAB_001b9734;
            }
            *(undefined8 *)((long)local_60 + lVar10) = *(undefined8 *)((long)local_68 + lVar10);
            ppuVar9 = from2;
            local_58 = n3;
            if (local_48 == 1) goto LAB_001b98d3;
            iVar7 = cmp(*(void **)((long)local_68 + lVar10 + 8),*from3);
            lVar10 = lVar10 + 8;
            local_48 = local_48 - 1;
          } while (iVar7 < 1);
          puVar1 = (undefined8 *)((long)local_68 + lVar10);
          local_68 = (uchar **)((long)local_68 + lVar10);
          iVar7 = cmp((void *)*puVar1,*from2);
          local_60 = (uchar **)((long)local_60 + lVar10);
          if (iVar7 < 1) goto LAB_001b8ede;
          iVar7 = cmp(*local_68,*from0);
          if (-1 < iVar7) goto LAB_001b9cb9;
LAB_001b870e:
          do {
            lVar10 = 0;
            do {
              iVar7 = cmp(*(void **)((long)from3 + lVar10),*from2);
              if (0 < iVar7) goto LAB_001b9dca;
              iVar7 = cmp(*from2,*local_68);
              if (0 < iVar7) {
                pcVar11 = "cmp(*from2, *from1) <= 0";
                goto LAB_001b916c;
              }
              iVar7 = cmp(*local_68,*from0);
              if (0 < iVar7) {
                pcVar11 = "cmp(*from1, *from0) <= 0";
                goto LAB_001b916c;
              }
              *(undefined8 *)((long)local_60 + lVar10) = *(undefined8 *)((long)from3 + lVar10);
              if (n3 == 1) goto LAB_001b9d64;
              iVar7 = cmp(*(void **)((long)from3 + lVar10 + 8),*from2);
              lVar10 = lVar10 + 8;
              n3 = n3 - 1;
            } while (iVar7 < 0);
            puVar1 = (undefined8 *)((long)from3 + lVar10);
            from3 = (uchar **)((long)from3 + lVar10);
            iVar7 = cmp((void *)*puVar1,*local_68);
            local_60 = (uchar **)((long)local_60 + lVar10);
            if (-1 < iVar7) {
              iVar7 = cmp(*from3,*from0);
              local_58 = n3;
              if (-1 < iVar7) goto LAB_001b8543;
              goto LAB_001b954a;
            }
LAB_001b8837:
            lVar10 = 0;
            do {
              iVar7 = cmp(*(void **)((long)from2 + lVar10),*from3);
              if (0 < iVar7) goto LAB_001b9db5;
              iVar7 = cmp(*from3,*local_68);
              if (0 < iVar7) {
                pcVar11 = "cmp(*from3, *from1) <= 0";
                goto LAB_001b9b03;
              }
              iVar7 = cmp(*local_68,*from0);
              if (0 < iVar7) {
                pcVar11 = "cmp(*from1, *from0) <= 0";
                goto LAB_001b9b03;
              }
              *(undefined8 *)((long)local_60 + lVar10) = *(undefined8 *)((long)from2 + lVar10);
              ppuVar9 = from3;
              local_58 = n3;
              if (local_40 == 1) goto LAB_001b9c8a;
              iVar7 = cmp(*(void **)((long)from2 + lVar10 + 8),*from3);
              lVar10 = lVar10 + 8;
              local_40 = local_40 - 1;
            } while (iVar7 < 1);
            puVar1 = (undefined8 *)((long)from2 + lVar10);
            from2 = (uchar **)((long)from2 + lVar10);
            iVar7 = cmp((void *)*puVar1,*local_68);
            local_60 = (uchar **)((long)local_60 + lVar10);
            if (-1 < iVar7) {
              iVar7 = cmp(*from2,*from0);
              if (-1 < iVar7) goto LAB_001b98f8;
LAB_001b8ede:
              lVar10 = 0;
              do {
                iVar7 = cmp(*(void **)((long)from3 + lVar10),*local_68);
                if (0 < iVar7) {
                  pcVar11 = "cmp(*from3, *from1) <= 0";
                  goto LAB_001b916c;
                }
                iVar7 = cmp(*local_68,*from2);
                if (0 < iVar7) {
                  pcVar11 = "cmp(*from1, *from2) <= 0";
                  goto LAB_001b916c;
                }
                iVar7 = cmp(*from2,*from0);
                if (0 < iVar7) goto LAB_001b9dd6;
                *(undefined8 *)((long)local_60 + lVar10) = *(undefined8 *)((long)from3 + lVar10);
                if (n3 == 1) goto LAB_001b9d64;
                iVar7 = cmp(*(void **)((long)from3 + lVar10 + 8),*local_68);
                lVar10 = lVar10 + 8;
                local_58 = n3 - 1;
                n3 = local_58;
              } while (iVar7 < 0);
              puVar1 = (undefined8 *)((long)from3 + lVar10);
              from3 = (uchar **)((long)from3 + lVar10);
              iVar7 = cmp((void *)*puVar1,*from2);
              local_60 = (uchar **)((long)local_60 + lVar10);
              if (-1 < iVar7) {
                iVar7 = cmp(*from3,*from0);
                if (iVar7 < 0) goto LAB_001b96ee;
LAB_001b8f8a:
                lVar10 = 0;
                do {
                  iVar7 = cmp(*(void **)((long)local_68 + lVar10),*from2);
                  if (0 < iVar7) {
                    pcVar11 = "cmp(*from1, *from2) <= 0";
                    goto LAB_001b936f;
                  }
                  iVar7 = cmp(*from2,*from0);
                  if (0 < iVar7) {
                    pcVar11 = "cmp(*from2, *from0) <= 0";
                    goto LAB_001b936f;
                  }
                  iVar7 = cmp(*from0,*from3);
                  if (0 < iVar7) goto LAB_001b945c;
                  *(undefined8 *)((long)local_60 + lVar10) =
                       *(undefined8 *)((long)local_68 + lVar10);
                  ppuVar9 = from2;
                  if (local_48 == 1) goto LAB_001b98d3;
                  iVar7 = cmp(*(void **)((long)local_68 + lVar10 + 8),*from2);
                  lVar10 = lVar10 + 8;
                  local_48 = local_48 - 1;
                } while (iVar7 < 1);
                puVar1 = (undefined8 *)((long)local_68 + lVar10);
                local_68 = (uchar **)((long)local_68 + lVar10);
                iVar7 = cmp((void *)*puVar1,*from0);
                local_60 = (uchar **)((long)local_60 + lVar10);
                if (-1 < iVar7) {
                  iVar7 = cmp(*local_68,*from3);
                  n3 = local_58;
                  if (iVar7 < 1) goto LAB_001b9d58;
LAB_001b9066:
                  do {
                    lVar10 = 0;
                    do {
                      iVar7 = cmp(*(void **)((long)from2 + lVar10),*from0);
                      if (0 < iVar7) goto LAB_001b9ad2;
                      iVar7 = cmp(*from0,*from3);
                      if (0 < iVar7) goto LAB_001b912a;
                      iVar7 = cmp(*from3,*local_68);
                      if (0 < iVar7) {
                        pcVar11 = "cmp(*from3, *from1) <= 0";
                        goto LAB_001b9aeb;
                      }
                      *(undefined8 *)((long)local_60 + lVar10) =
                           *(undefined8 *)((long)from2 + lVar10);
                      ppuVar9 = from3;
                      local_58 = n3;
                      if (local_40 == 1) goto LAB_001b9c8a;
                      iVar7 = cmp(*(void **)((long)from2 + lVar10 + 8),*from0);
                      lVar10 = lVar10 + 8;
                      local_40 = local_40 - 1;
                    } while (iVar7 < 0);
                    puVar1 = (undefined8 *)((long)from2 + lVar10);
                    from2 = (uchar **)((long)from2 + lVar10);
                    iVar7 = cmp((void *)*puVar1,*from3);
                    local_60 = (uchar **)((long)local_60 + lVar10);
                    if (iVar7 < 1) goto LAB_001b98cc;
                    iVar7 = cmp(*from2,*local_68);
                    if (-1 < iVar7) goto LAB_001b9dae;
LAB_001b99bf:
                    lVar10 = 0;
                    do {
                      iVar7 = cmp(*(void **)((long)from0 + lVar10),*from3);
                      if (0 < iVar7) goto LAB_001b8ed2;
                      iVar7 = cmp(*from3,*from2);
                      if (0 < iVar7) {
                        pcVar11 = "cmp(*from3, *from2) <= 0";
                        goto LAB_001b8df6;
                      }
                      iVar7 = cmp(*from2,*local_68);
                      if (0 < iVar7) {
                        pcVar11 = "cmp(*from2, *from1) <= 0";
                        goto LAB_001b8df6;
                      }
                      *(undefined8 *)((long)local_60 + lVar10) =
                           *(undefined8 *)((long)from0 + lVar10);
                      local_58 = n3;
                      ppuVar9 = from2;
                      ppuVar6 = from3;
                      if (local_50 == 1) goto LAB_001b9237;
                      iVar7 = cmp(*(void **)((long)from0 + lVar10 + 8),*from3);
                      lVar10 = lVar10 + 8;
                      local_50 = local_50 - 1;
                    } while (iVar7 < 1);
                    puVar1 = (undefined8 *)((long)from0 + lVar10);
                    from0 = (uchar **)((long)from0 + lVar10);
                    iVar7 = cmp((void *)*puVar1,*from2);
                    local_60 = (uchar **)((long)local_60 + lVar10);
                    if (iVar7 < 1) goto LAB_001b9825;
                    iVar7 = cmp(*from0,*local_68);
                    if (0 < iVar7) goto LAB_001b870e;
LAB_001b9cb9:
                    lVar10 = 0;
                    do {
                      iVar7 = cmp(*(void **)((long)from3 + lVar10),*from2);
                      if (0 < iVar7) goto LAB_001b9dca;
                      iVar7 = cmp(*from2,*from0);
                      if (0 < iVar7) goto LAB_001b9dd6;
                      iVar7 = cmp(*from0,*local_68);
                      if (0 < iVar7) {
                        pcVar11 = "cmp(*from0, *from1) <= 0";
                        goto LAB_001b916c;
                      }
                      *(undefined8 *)((long)local_60 + lVar10) =
                           *(undefined8 *)((long)from3 + lVar10);
                      if (n3 == 1) goto LAB_001b9d64;
                      iVar7 = cmp(*(void **)((long)from3 + lVar10 + 8),*from2);
                      lVar10 = lVar10 + 8;
                      n3 = n3 - 1;
                    } while (iVar7 < 0);
                    puVar1 = (undefined8 *)((long)from3 + lVar10);
                    from3 = (uchar **)((long)from3 + lVar10);
                    iVar7 = cmp((void *)*puVar1,*from0);
                    local_60 = (uchar **)((long)local_60 + lVar10);
                    if (iVar7 < 0) goto LAB_001b9da2;
                    iVar7 = cmp(*from3,*local_68);
joined_r0x001b9d52:
                    if (-1 < iVar7) {
LAB_001b9d58:
                      lVar10 = 0;
                      do {
                        iVar7 = cmp(*(void **)((long)from2 + lVar10),*from0);
                        if (0 < iVar7) goto LAB_001b9ad2;
                        iVar7 = cmp(*from0,*local_68);
                        if (0 < iVar7) {
                          pcVar11 = "cmp(*from0, *from1) <= 0";
                          goto LAB_001b9aeb;
                        }
                        iVar7 = cmp(*local_68,*from3);
                        if (0 < iVar7) {
                          pcVar11 = "cmp(*from1, *from3) <= 0";
                          goto LAB_001b9aeb;
                        }
                        *(undefined8 *)((long)local_60 + lVar10) =
                             *(undefined8 *)((long)from2 + lVar10);
                        ppuVar9 = from3;
                        local_58 = n3;
                        if (local_40 == 1) goto LAB_001b9c8a;
                        iVar7 = cmp(*(void **)((long)from2 + lVar10 + 8),*from0);
                        lVar10 = lVar10 + 8;
                        local_40 = local_40 - 1;
                      } while (iVar7 < 0);
                      puVar1 = (undefined8 *)((long)from2 + lVar10);
                      from2 = (uchar **)((long)from2 + lVar10);
                      iVar7 = cmp((void *)*puVar1,*local_68);
                      local_60 = (uchar **)((long)local_60 + lVar10);
                      if (-1 < iVar7) {
                        iVar7 = cmp(*from2,*from3);
                        if (iVar7 < 1) goto LAB_001b9c83;
LAB_001b9ac4:
                        lVar10 = 0;
                        do {
                          iVar7 = cmp(*(void **)((long)from0 + lVar10),*local_68);
                          if (0 < iVar7) goto LAB_001b8b70;
                          iVar7 = cmp(*local_68,*from3);
                          if (0 < iVar7) goto LAB_001b8c4e;
                          iVar7 = cmp(*from3,*from2);
                          if (0 < iVar7) {
                            pcVar11 = "cmp(*from3, *from2) <= 0";
                            goto LAB_001b8b77;
                          }
                          *(undefined8 *)((long)local_60 + lVar10) =
                               *(undefined8 *)((long)from0 + lVar10);
                          local_58 = n3;
                          ppuVar9 = from2;
                          ppuVar6 = from3;
                          if (local_50 == 1) goto LAB_001b9237;
                          iVar7 = cmp(*(void **)((long)from0 + lVar10 + 8),*local_68);
                          lVar10 = lVar10 + 8;
                          local_50 = local_50 - 1;
                        } while (iVar7 < 1);
                        puVar1 = (undefined8 *)((long)from0 + lVar10);
                        from0 = (uchar **)((long)from0 + lVar10);
                        iVar7 = cmp((void *)*puVar1,*from3);
                        local_60 = (uchar **)((long)local_60 + lVar10);
                        if (iVar7 < 1) goto LAB_001b99a7;
                        iVar7 = cmp(*from0,*from2);
                        if (iVar7 < 1) {
LAB_001b99b3:
                          lVar10 = 0;
                          do {
                            iVar7 = cmp(*(void **)((long)local_68 + lVar10),*from3);
                            if (0 < iVar7) goto LAB_001b99d2;
                            iVar7 = cmp(*from3,*from0);
                            if (0 < iVar7) goto LAB_001b974c;
                            iVar7 = cmp(*from0,*from2);
                            if (0 < iVar7) {
                              pcVar11 = "cmp(*from0, *from2) <= 0";
                              goto LAB_001b9734;
                            }
                            *(undefined8 *)((long)local_60 + lVar10) =
                                 *(undefined8 *)((long)local_68 + lVar10);
                            ppuVar9 = from2;
                            local_58 = n3;
                            if (local_48 == 1) goto LAB_001b98d3;
                            iVar7 = cmp(*(void **)((long)local_68 + lVar10 + 8),*from3);
                            lVar10 = lVar10 + 8;
                            local_48 = local_48 - 1;
                          } while (iVar7 < 1);
                          puVar1 = (undefined8 *)((long)local_68 + lVar10);
                          local_68 = (uchar **)((long)local_68 + lVar10);
                          iVar7 = cmp((void *)*puVar1,*from0);
                          local_60 = (uchar **)((long)local_60 + lVar10);
                          if (iVar7 < 0) goto LAB_001b98f8;
                          iVar7 = cmp(*local_68,*from2);
                          if (iVar7 < 1) goto LAB_001b9bd8;
LAB_001b9825:
                          while( true ) {
                            lVar10 = 0;
                            do {
                              iVar7 = cmp(*(void **)((long)from3 + lVar10),*from0);
                              if (0 < iVar7) goto LAB_001b9dc1;
                              iVar7 = cmp(*from0,*from2);
                              if (0 < iVar7) goto LAB_001b99c6;
                              iVar7 = cmp(*from2,*local_68);
                              if (0 < iVar7) {
                                pcVar11 = "cmp(*from2, *from1) <= 0";
                                goto LAB_001b9df2;
                              }
                              *(undefined8 *)((long)local_60 + lVar10) =
                                   *(undefined8 *)((long)from3 + lVar10);
                              if (n3 == 1) goto LAB_001b9d64;
                              iVar7 = cmp(*(void **)((long)from3 + lVar10 + 8),*from0);
                              lVar10 = lVar10 + 8;
                              n3 = n3 - 1;
                            } while (iVar7 < 0);
                            puVar1 = (undefined8 *)((long)from3 + lVar10);
                            from3 = (uchar **)((long)from3 + lVar10);
                            iVar7 = cmp((void *)*puVar1,*from2);
                            local_60 = (uchar **)((long)local_60 + lVar10);
                            if (iVar7 < 0) break;
                            iVar7 = cmp(*from3,*local_68);
joined_r0x001b8679:
                            if (-1 < iVar7) goto LAB_001b9acb;
LAB_001b98cc:
                            lVar10 = 0;
                            do {
                              iVar7 = cmp(*(void **)((long)from0 + lVar10),*from2);
                              if (0 < iVar7) {
                                pcVar11 = "cmp(*from0, *from2) <= 0";
                                goto LAB_001b8df6;
                              }
                              iVar7 = cmp(*from2,*from3);
                              if (0 < iVar7) {
                                pcVar11 = "cmp(*from2, *from3) <= 0";
                                goto LAB_001b8df6;
                              }
                              iVar7 = cmp(*from3,*local_68);
                              if (0 < iVar7) goto LAB_001b8e0e;
                              *(undefined8 *)((long)local_60 + lVar10) =
                                   *(undefined8 *)((long)from0 + lVar10);
                              local_58 = n3;
                              ppuVar9 = from2;
                              ppuVar6 = from3;
                              if (local_50 == 1) goto LAB_001b9237;
                              iVar7 = cmp(*(void **)((long)from0 + lVar10 + 8),*from2);
                              lVar10 = lVar10 + 8;
                              local_50 = local_50 - 1;
                            } while (iVar7 < 1);
                            puVar1 = (undefined8 *)((long)from0 + lVar10);
                            from0 = (uchar **)((long)from0 + lVar10);
                            iVar7 = cmp((void *)*puVar1,*from3);
                            local_60 = (uchar **)((long)local_60 + lVar10);
                            if (iVar7 < 1) goto LAB_001b9066;
                            iVar7 = cmp(*from0,*local_68);
                            if (0 < iVar7) goto LAB_001b8837;
LAB_001b9da2:
                            while( true ) {
                              lVar10 = 0;
                              do {
                                iVar7 = cmp(*(void **)((long)from2 + lVar10),*from3);
                                if (0 < iVar7) goto LAB_001b9db5;
                                iVar7 = cmp(*from3,*from0);
                                if (0 < iVar7) goto LAB_001b9b1b;
                                iVar7 = cmp(*from0,*local_68);
                                if (0 < iVar7) {
                                  pcVar11 = "cmp(*from0, *from1) <= 0";
                                  goto LAB_001b9b03;
                                }
                                *(undefined8 *)((long)local_60 + lVar10) =
                                     *(undefined8 *)((long)from2 + lVar10);
                                ppuVar9 = from3;
                                local_58 = n3;
                                if (local_40 == 1) goto LAB_001b9c8a;
                                iVar7 = cmp(*(void **)((long)from2 + lVar10 + 8),*from3);
                                lVar10 = lVar10 + 8;
                                local_40 = local_40 - 1;
                              } while (iVar7 < 1);
                              puVar1 = (undefined8 *)((long)from2 + lVar10);
                              from2 = (uchar **)((long)from2 + lVar10);
                              iVar7 = cmp((void *)*puVar1,*from0);
                              local_60 = (uchar **)((long)local_60 + lVar10);
                              if (iVar7 < 0) goto LAB_001b9cb9;
                              iVar7 = cmp(*from2,*local_68);
                              if (iVar7 < 0) break;
LAB_001b9bd8:
                              while( true ) {
                                lVar10 = 0;
                                do {
                                  iVar7 = cmp(*(void **)((long)from3 + lVar10),*from0);
                                  if (0 < iVar7) goto LAB_001b9dc1;
                                  iVar7 = cmp(*from0,*local_68);
                                  if (0 < iVar7) {
                                    pcVar11 = "cmp(*from0, *from1) <= 0";
                                    goto LAB_001b9df2;
                                  }
                                  iVar7 = cmp(*local_68,*from2);
                                  if (0 < iVar7) {
                                    pcVar11 = "cmp(*from1, *from2) <= 0";
                                    goto LAB_001b9df2;
                                  }
                                  *(undefined8 *)((long)local_60 + lVar10) =
                                       *(undefined8 *)((long)from3 + lVar10);
                                  if (n3 == 1) goto LAB_001b9d64;
                                  iVar7 = cmp(*(void **)((long)from3 + lVar10 + 8),*from0);
                                  lVar10 = lVar10 + 8;
                                  n3 = n3 - 1;
                                } while (iVar7 < 0);
                                puVar1 = (undefined8 *)((long)from3 + lVar10);
                                from3 = (uchar **)((long)from3 + lVar10);
                                iVar7 = cmp((void *)*puVar1,*local_68);
                                local_60 = (uchar **)((long)local_60 + lVar10);
                                if (-1 < iVar7) break;
LAB_001b9dae:
                                while( true ) {
                                  lVar10 = 0;
                                  do {
                                    iVar7 = cmp(*(void **)((long)from0 + lVar10),*from3);
                                    if (0 < iVar7) goto LAB_001b8ed2;
                                    iVar7 = cmp(*from3,*local_68);
                                    if (0 < iVar7) goto LAB_001b8e0e;
                                    iVar7 = cmp(*local_68,*from2);
                                    if (0 < iVar7) {
                                      pcVar11 = "cmp(*from1, *from2) <= 0";
                                      goto LAB_001b8df6;
                                    }
                                    *(undefined8 *)((long)local_60 + lVar10) =
                                         *(undefined8 *)((long)from0 + lVar10);
                                    local_58 = n3;
                                    ppuVar9 = from2;
                                    ppuVar6 = from3;
                                    if (local_50 == 1) goto LAB_001b9237;
                                    iVar7 = cmp(*(void **)((long)from0 + lVar10 + 8),*from3);
                                    lVar10 = lVar10 + 8;
                                    local_50 = local_50 - 1;
                                  } while (iVar7 < 1);
                                  puVar1 = (undefined8 *)((long)from0 + lVar10);
                                  from0 = (uchar **)((long)from0 + lVar10);
                                  iVar7 = cmp((void *)*puVar1,*local_68);
                                  local_60 = (uchar **)((long)local_60 + lVar10);
                                  if (iVar7 < 1) break;
                                  iVar7 = cmp(*from0,*from2);
                                  if (0 < iVar7) goto LAB_001b8ede;
LAB_001b98f8:
                                  lVar10 = 0;
                                  do {
                                    iVar7 = cmp(*(void **)((long)from3 + lVar10),*local_68);
                                    if (0 < iVar7) {
                                      pcVar11 = "cmp(*from3, *from1) <= 0";
                                      goto LAB_001b9df2;
                                    }
                                    iVar7 = cmp(*local_68,*from0);
                                    if (0 < iVar7) {
                                      pcVar11 = "cmp(*from1, *from0) <= 0";
                                      goto LAB_001b9df2;
                                    }
                                    iVar7 = cmp(*from0,*from2);
                                    if (0 < iVar7) goto LAB_001b99c6;
                                    *(undefined8 *)((long)local_60 + lVar10) =
                                         *(undefined8 *)((long)from3 + lVar10);
                                    if (n3 == 1) goto LAB_001b9d64;
                                    iVar7 = cmp(*(void **)((long)from3 + lVar10 + 8),*local_68);
                                    lVar10 = lVar10 + 8;
                                    n3 = n3 - 1;
                                  } while (iVar7 < 0);
                                  puVar1 = (undefined8 *)((long)from3 + lVar10);
                                  from3 = (uchar **)((long)from3 + lVar10);
                                  iVar7 = cmp((void *)*puVar1,*from0);
                                  local_60 = (uchar **)((long)local_60 + lVar10);
                                  if (iVar7 < 0) goto LAB_001b99b3;
                                  iVar7 = cmp(*from3,*from2);
joined_r0x001b898c:
                                  if (-1 < iVar7) goto LAB_001b999b;
LAB_001b99a7:
                                  lVar10 = 0;
                                  do {
                                    iVar7 = cmp(*(void **)((long)local_68 + lVar10),*from0);
                                    if (0 < iVar7) goto LAB_001b9368;
                                    iVar7 = cmp(*from0,*from3);
                                    if (0 < iVar7) goto LAB_001b945c;
                                    iVar7 = cmp(*from3,*from2);
                                    if (0 < iVar7) {
                                      pcVar11 = "cmp(*from3, *from2) <= 0";
                                      goto LAB_001b936f;
                                    }
                                    *(undefined8 *)((long)local_60 + lVar10) =
                                         *(undefined8 *)((long)local_68 + lVar10);
                                    ppuVar9 = from2;
                                    local_58 = n3;
                                    if (local_48 == 1) goto LAB_001b98d3;
                                    iVar7 = cmp(*(void **)((long)local_68 + lVar10 + 8),*from0);
                                    lVar10 = lVar10 + 8;
                                    local_48 = local_48 - 1;
                                  } while (iVar7 < 0);
                                  puVar1 = (undefined8 *)((long)local_68 + lVar10);
                                  local_68 = (uchar **)((long)local_68 + lVar10);
                                  iVar7 = cmp((void *)*puVar1,*from3);
                                  local_60 = (uchar **)((long)local_60 + lVar10);
                                  if (iVar7 < 1) goto LAB_001b9ac4;
                                  iVar7 = cmp(*local_68,*from2);
                                  if (0 < iVar7) goto LAB_001b99bf;
                                }
                              }
                              iVar7 = cmp(*from3,*from2);
                              if (iVar7 < 0) goto LAB_001b9ac4;
LAB_001b9c83:
                              lVar10 = 0;
                              do {
                                iVar7 = cmp(*(void **)((long)from0 + lVar10),*local_68);
                                if (0 < iVar7) goto LAB_001b8b70;
                                iVar7 = cmp(*local_68,*from2);
                                if (0 < iVar7) {
                                  pcVar11 = "cmp(*from1, *from2) <= 0";
                                  goto LAB_001b8b77;
                                }
                                iVar7 = cmp(*from2,*from3);
                                if (0 < iVar7) {
                                  pcVar11 = "cmp(*from2, *from3) <= 0";
                                  goto LAB_001b8b77;
                                }
                                *(undefined8 *)((long)local_60 + lVar10) =
                                     *(undefined8 *)((long)from0 + lVar10);
                                local_58 = n3;
                                ppuVar9 = from2;
                                ppuVar6 = from3;
                                if (local_50 == 1) goto LAB_001b9237;
                                iVar7 = cmp(*(void **)((long)from0 + lVar10 + 8),*local_68);
                                lVar10 = lVar10 + 8;
                                local_50 = local_50 - 1;
                              } while (iVar7 < 1);
                              puVar1 = (undefined8 *)((long)from0 + lVar10);
                              from0 = (uchar **)((long)from0 + lVar10);
                              iVar7 = cmp((void *)*puVar1,*from2);
                              local_60 = (uchar **)((long)local_60 + lVar10);
                              if (iVar7 < 1) goto LAB_001b999b;
                              iVar7 = cmp(*from0,*from3);
                              if (iVar7 < 1) goto LAB_001b8f8a;
LAB_001b96ee:
                              lVar10 = 0;
                              do {
                                iVar7 = cmp(*(void **)((long)local_68 + lVar10),*from2);
                                if (0 < iVar7) {
                                  pcVar11 = "cmp(*from1, *from2) <= 0";
                                  goto LAB_001b9734;
                                }
                                iVar7 = cmp(*from2,*from3);
                                if (0 < iVar7) {
                                  pcVar11 = "cmp(*from2, *from3) <= 0";
                                  goto LAB_001b9734;
                                }
                                iVar7 = cmp(*from3,*from0);
                                if (0 < iVar7) goto LAB_001b974c;
                                *(undefined8 *)((long)local_60 + lVar10) =
                                     *(undefined8 *)((long)local_68 + lVar10);
                                ppuVar9 = from2;
                                if (local_48 == 1) goto LAB_001b98d3;
                                iVar7 = cmp(*(void **)((long)local_68 + lVar10 + 8),*from2);
                                lVar10 = lVar10 + 8;
                                local_48 = local_48 - 1;
                              } while (iVar7 < 1);
                              puVar1 = (undefined8 *)((long)local_68 + lVar10);
                              local_68 = (uchar **)((long)local_68 + lVar10);
                              iVar7 = cmp((void *)*puVar1,*from3);
                              local_60 = (uchar **)((long)local_60 + lVar10);
                              if (iVar7 < 1) goto LAB_001b954a;
                              iVar7 = cmp(*local_68,*from0);
                              n3 = local_58;
                              if (iVar7 < 0) goto LAB_001b8837;
                            }
                          }
                          goto LAB_001b99bf;
                        }
                        goto LAB_001b960d;
                      }
                      goto LAB_001b9acb;
                    }
                  } while( true );
                }
                goto LAB_001b8543;
              }
              goto LAB_001b960d;
            }
          } while( true );
        }
      }
      pcVar11 = "cmp(*from1, *from3) <= 0";
      goto LAB_001b9b03;
    }
  } while( true );
LAB_001b912a:
  pcVar11 = "cmp(*from0, *from3) <= 0";
  goto LAB_001b9aeb;
LAB_001b9dca:
  pcVar11 = "cmp(*from3, *from2) <= 0";
  goto LAB_001b916c;
LAB_001b8c4e:
  pcVar11 = "cmp(*from1, *from3) <= 0";
  goto LAB_001b8b77;
LAB_001b99d2:
  pcVar11 = "cmp(*from1, *from3) <= 0";
  goto LAB_001b9734;
LAB_001b9db5:
  pcVar11 = "cmp(*from2, *from3) <= 0";
  goto LAB_001b9b03;
LAB_001b9c8a:
  from2 = ppuVar9;
  lVar10 = (long)local_60 + lVar10;
  local_40 = local_48;
  goto LAB_001b9cac;
LAB_001b9dc1:
  pcVar11 = "cmp(*from3, *from0) <= 0";
  goto LAB_001b9df2;
LAB_001b8ed2:
  pcVar11 = "cmp(*from0, *from3) <= 0";
  goto LAB_001b8df6;
LAB_001b9237:
  from2 = ppuVar6;
  local_60 = (uchar **)((long)local_60 + lVar10 + 8);
  n1_00 = local_40;
  local_50 = local_48;
  from0 = local_68;
  goto LAB_001b9d8e;
LAB_001b9d64:
  local_60 = (uchar **)((long)local_60 + lVar10 + 8);
  n1_00 = local_48;
  ppuVar9 = local_68;
  local_58 = local_40;
  goto LAB_001b9d8e;
LAB_001b9368:
  pcVar11 = "cmp(*from1, *from0) <= 0";
  goto LAB_001b936f;
LAB_001b98d3:
  local_68 = ppuVar9;
  lVar10 = (long)local_60 + lVar10;
  from2 = from3;
LAB_001b9cac:
  local_60 = (uchar **)(lVar10 + 8);
  n1_00 = local_40;
  ppuVar9 = local_68;
LAB_001b9d8e:
  merge_3way(from0,local_50,ppuVar9,n1_00,from2,local_58,local_60);
  return;
LAB_001b945c:
  pcVar11 = "cmp(*from0, *from3) <= 0";
LAB_001b936f:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x1b0,
                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
LAB_001b99c6:
  pcVar11 = "cmp(*from0, *from2) <= 0";
LAB_001b9df2:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x1b4,
                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
LAB_001b8e0e:
  pcVar11 = "cmp(*from3, *from1) <= 0";
LAB_001b8df6:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x1af,
                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
LAB_001b974c:
  pcVar11 = "cmp(*from3, *from0) <= 0";
LAB_001b9734:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x1b1,
                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
LAB_001b8b70:
  pcVar11 = "cmp(*from0, *from1) <= 0";
LAB_001b8b77:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x1ae,
                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
LAB_001b9b1b:
  pcVar11 = "cmp(*from3, *from0) <= 0";
LAB_001b9b03:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x1b3,
                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
LAB_001b9ad2:
  pcVar11 = "cmp(*from2, *from0) <= 0";
LAB_001b9aeb:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x1b2,
                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
LAB_001b9dd6:
  pcVar11 = "cmp(*from2, *from0) <= 0";
LAB_001b916c:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x1b5,
                "void merge_4way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
}

Assistant:

static void
merge_4way(unsigned char** restrict from0, size_t n0,
           unsigned char** restrict from1, size_t n1,
           unsigned char** restrict from2, size_t n2,
           unsigned char** restrict from3, size_t n3,
           unsigned char** restrict result)
{
	debug()<<__func__<<"(), n0="<<n0<<", n1="<<n1<<", n2="<<n2
	       <<", n3="<<n3<<"\n";
	if (cmp(*from0, *from1) <= 0) {
		if (cmp(*from1, *from2) <= 0) {
			/* 0 <= 1 <= 2 */
			if (cmp(*from3, *from0) < 0) goto state_3012;
			if (cmp(*from3, *from1) < 0) goto state_0312;
			if (cmp(*from3, *from2) < 0) goto state_0132;
			goto state_0123;
		}
		if (cmp(*from2, *from0) < 0) {
			/* 2 < 0 <= 1 */
			if (cmp(*from3, *from2) < 0) goto state_3201;
			if (cmp(*from3, *from0) < 0) goto state_2301;
			if (cmp(*from3, *from1) < 0) goto state_2031;
			goto state_2013;
		}
		/* 0 <= 2 < 1 */
		if (cmp(*from3, *from0) < 0) goto state_3021;
		if (cmp(*from3, *from2) < 0) goto state_0321;
		if (cmp(*from3, *from1) < 0) goto state_0231;
		goto state_0213;
	}
	if (cmp(*from1, *from2) <= 0) {
		if (cmp(*from0, *from2) <= 0) {
			/* 1 < 0 <= 2 */
			if (cmp(*from3, *from1) < 0) goto state_3102;
			if (cmp(*from3, *from0) < 0) goto state_1302;
			if (cmp(*from3, *from2) < 0) goto state_1032;
			goto state_1023;
		}
		/* 1 <= 2 < 0 */
		if (cmp(*from3, *from1) < 0) goto state_3120;
		if (cmp(*from3, *from2) < 0) goto state_1320;
		if (cmp(*from3, *from0) < 0) goto state_1230;
		goto state_1203;
	}
	/* 2 < 1 < 0 */
	if (cmp(*from3, *from2) < 0) goto state_3210;
	if (cmp(*from3, *from1) < 0) goto state_2310;
	if (cmp(*from3, *from0) < 0) goto state_2130;
	goto state_2103;

#define MAKE_STATE(a,b,c,d)                                                    \
        state_ ## a ## b ## c ## d:                                            \
        assert(cmp(*from ## a, *from ## b) <= 0);                              \
        assert(cmp(*from ## b, *from ## c) <= 0);                              \
        assert(cmp(*from ## c, *from ## d) <= 0);                              \
        *result++ = *from ## a ++;                                             \
        if (--n ## a == 0) goto finish ## a ;                                  \
        if (a < b) if (cmp(*from##a, *from##b) <= 0) goto state_##a##b##c##d;  \
        if (a > b) if (cmp(*from##a, *from##b) <  0) goto state_##a##b##c##d;  \
        if (a < c) if (cmp(*from##a, *from##c) <= 0) goto state_##b##a##c##d;  \
        if (a > c) if (cmp(*from##a, *from##c) <  0) goto state_##b##a##c##d;  \
        if (a < d) if (cmp(*from##a, *from##d) <= 0) goto state_##b##c##a##d;  \
        if (a > d) if (cmp(*from##a, *from##d) <  0) goto state_##b##c##a##d;  \
        goto state_ ## b ## c ## d ## a;

	MAKE_STATE(0, 1, 2, 3); MAKE_STATE(0, 1, 3, 2); MAKE_STATE(0, 2, 1, 3);
	MAKE_STATE(0, 2, 3, 1); MAKE_STATE(0, 3, 1, 2); MAKE_STATE(0, 3, 2, 1);
	MAKE_STATE(1, 0, 2, 3); MAKE_STATE(1, 0, 3, 2); MAKE_STATE(1, 2, 0, 3);
	MAKE_STATE(1, 2, 3, 0); MAKE_STATE(1, 3, 0, 2); MAKE_STATE(1, 3, 2, 0);
	MAKE_STATE(2, 0, 1, 3); MAKE_STATE(2, 0, 3, 1); MAKE_STATE(2, 1, 0, 3);
	MAKE_STATE(2, 1, 3, 0); MAKE_STATE(2, 3, 0, 1); MAKE_STATE(2, 3, 1, 0);
	MAKE_STATE(3, 0, 1, 2); MAKE_STATE(3, 0, 2, 1); MAKE_STATE(3, 1, 0, 2);
	MAKE_STATE(3, 1, 2, 0); MAKE_STATE(3, 2, 0, 1); MAKE_STATE(3, 2, 1, 0);
#undef MAKE_STATE

finish0:
	assert(n0 == 0);
	merge_3way(from1, n1, from2, n2, from3, n3, result);
	return;
finish1:
	assert(n1 == 0);
	merge_3way(from0, n0, from2, n2, from3, n3, result);
	return;
finish2:
	assert(n2 == 0);
	merge_3way(from0, n0, from1, n1, from3, n3, result);
	return;
finish3:
	assert(n3 == 0);
	merge_3way(from0, n0, from1, n1, from2, n2, result);
	return;
}